

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_classes.h
# Opt level: O0

filtered_directed_graph_t *
read_filtered_directed_graph(string *input_filename,flagser_parameters *params)

{
  bool bVar1;
  ostream *poVar2;
  long lVar3;
  invalid_argument *this;
  string *in_RSI;
  filtered_directed_graph_t *in_RDI;
  string err_msg;
  flagser_parameters *in_stack_00000600;
  string *in_stack_00000608;
  char *in_stack_ffffffffffffff18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  string local_a8 [8];
  flagser_parameters *in_stack_ffffffffffffff60;
  undefined8 in_stack_ffffffffffffff68;
  string local_88 [32];
  string local_68 [48];
  string local_38 [56];
  
  poVar2 = std::operator<<((ostream *)&std::cout,"\x1b[K");
  poVar2 = std::operator<<(poVar2,"reading in the graph");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::flush<char,std::char_traits<char>>);
  std::operator<<(poVar2,"\r");
  bVar1 = std::operator==(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  if (((!bVar1) && (lVar3 = std::__cxx11::string::size(), lVar3 == 0)) &&
     (lVar3 = std::__cxx11::string::rfind((char *)in_RSI,0x1573eb), lVar3 == -1)) {
    bVar1 = std::operator==(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    if (bVar1) {
      std::__cxx11::string::string(local_68,in_RSI);
      read_graph_flagser(in_stack_00000608,in_stack_00000600);
      std::__cxx11::string::~string(local_68);
      return in_RDI;
    }
    std::operator<<((ostream *)&std::cout,"\x1b[K");
    __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8;
    std::operator+((char *)in_stack_ffffffffffffff68,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffff60);
    std::operator+(__lhs,(char *)in_stack_ffffffffffffff20);
    std::__cxx11::string::~string(local_a8);
    this = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this,local_88);
    __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  std::__cxx11::string::string(local_38,in_RSI);
  read_graph_h5((string *)in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  std::__cxx11::string::~string(local_38);
  return in_RDI;
}

Assistant:

filtered_directed_graph_t read_filtered_directed_graph(std::string input_filename, const flagser_parameters& params) {
#ifdef INDICATE_PROGRESS
	std::cout << "\033[K"
	          << "reading in the graph" << std::flush << "\r";
#endif

	if (params.input_format == "h5" || params.hdf5_type.size() > 0 ||
	    (input_filename.rfind(".h5") != std::string::npos)) {
		return read_graph_h5(input_filename, params);
	}
	if (params.input_format == "flagser") return read_graph_flagser(input_filename, params);

#ifdef INDICATE_PROGRESS
	std::cout << "\033[K";
#endif

	std::string err_msg = "The input format \"" + params.input_format + "\" could not be found.";
	throw std::invalid_argument(err_msg);
}